

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  ostream *poVar2;
  SolveResult SVar3;
  SolveResult result;
  Board board;
  allocator local_51;
  undefined1 local_50 [32];
  Board local_30;
  
  if (argc == 2) {
    Board::Board(&local_30);
    std::__cxx11::string::string((string *)local_50,argv[1],&local_51);
    bVar1 = Board::load(&local_30,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    if (bVar1) {
      Board::print(&local_30);
      poVar2 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar2);
      SolveResult::SolveResult((SolveResult *)local_50);
      bVar1 = Board::isSolveable(&local_30);
      if (bVar1) {
        std::chrono::_V2::steady_clock::now();
        poVar2 = std::operator<<((ostream *)&std::cout,"solving...");
        poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
        std::endl<char,std::char_traits<char>>(poVar2);
        SVar3 = Board::solve(&local_30);
        local_50._0_4_ = SVar3.backtracks;
        local_50[4] = SVar3.solved;
        std::chrono::_V2::steady_clock::now();
        if (local_50[4] == true) {
          Board::print(&local_30);
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar2 = std::operator<<((ostream *)&std::cout,"solved in ");
          poVar2 = std::ostream::_M_insert<long>((long)poVar2);
          poVar2 = std::operator<<(poVar2," ms");
          std::endl<char,std::char_traits<char>>(poVar2);
          poVar2 = std::operator<<((ostream *)&std::cout,"with backtracks: ");
          poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
          std::endl<char,std::char_traits<char>>(poVar2);
        }
      }
      if (local_50[4] == false) {
        poVar2 = std::operator<<((ostream *)&std::cout,"is not solveable");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cout,"could not load ");
      poVar2 = std::operator<<(poVar2,argv[1]);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,"press any key to exit...");
    std::endl<char,std::char_traits<char>>(poVar2);
    getchar();
    Board::~Board(&local_30);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	if (argc == 2)
	{
		Board board{};

		if (board.load(argv[1]))
		{
			board.print();

			std::cout << std::endl << std::endl;

			SolveResult result{};

			if (board.isSolveable())
			{
				auto begin = std::chrono::steady_clock::now();

				std::cout << "solving..." << std::endl << std::endl;
				result = board.solve();

				auto end = std::chrono::steady_clock::now();

				auto elapsedMilliseconds = std::chrono::duration_cast<std::chrono::milliseconds>(end - begin).count();

				if (result.solved)
				{
					board.print();
					std::cout << std::endl;
					std::cout << "solved in " << elapsedMilliseconds << " ms" << std::endl;
					std::cout << "with backtracks: " << result.backtracks << std::endl;
				}
			}

			if(!result.solved)
			{
				std::cout << "is not solveable" << std::endl;
			}
		}
		else
		{
			std::cout << "could not load " << argv[1] << std::endl;
		}

		std::cout << "press any key to exit..." << std::endl;
		std::getchar();
	}

	return 0;
}